

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

void __thiscall
CRegexStack::swap(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                 re_state_id *final,re_group_register *regs,short *loop_vars)

{
  short sVar1;
  int iVar2;
  int iVar3;
  re_state_id rVar4;
  char *pcVar5;
  size_t sVar6;
  anon_union_8_3_6cd4419a_for_val aVar7;
  short tmp_1;
  re_group_register tmp;
  regex_stack_var *var;
  re_state_id tmp_id;
  size_t tmp_len;
  int tmp_ofs;
  regex_stack_entry *fp;
  re_state_id *final_local;
  re_state_id *state_local;
  size_t *curlen_local;
  int *str_ofs_local;
  int *start_ofs_local;
  CRegexStack *this_local;
  
  pcVar5 = this->buf_;
  iVar2 = this->sp_;
  iVar3 = *str_ofs;
  *str_ofs = *(int *)(pcVar5 + (long)iVar2 + 8);
  *(int *)(pcVar5 + (long)iVar2 + 8) = iVar3;
  iVar3 = *start_ofs;
  *start_ofs = *(int *)(pcVar5 + (long)iVar2 + 4);
  *(int *)(pcVar5 + (long)iVar2 + 4) = iVar3;
  sVar6 = *curlen;
  *curlen = (long)*(int *)(pcVar5 + (long)iVar2 + 0xc);
  *(int *)(pcVar5 + (long)iVar2 + 0xc) = (int)sVar6;
  rVar4 = *state;
  *state = *(re_state_id *)(pcVar5 + (long)iVar2 + 0x10);
  *(re_state_id *)(pcVar5 + (long)iVar2 + 0x10) = rVar4;
  rVar4 = *final;
  *final = *(re_state_id *)(pcVar5 + (long)iVar2 + 0x14);
  *(re_state_id *)(pcVar5 + (long)iVar2 + 0x14) = rVar4;
  for (var = (regex_stack_var *)(pcVar5 + (long)iVar2 + 0x24);
      var < (regex_stack_var *)(this->buf_ + this->used_); var = var + 1) {
    if (var->id < 10) {
      aVar7 = *(anon_union_8_3_6cd4419a_for_val *)(regs + var->id);
      *(anon_union_8_3_6cd4419a_for_val *)(regs + var->id) = var->val;
      var->val = aVar7;
    }
    else {
      sVar1 = loop_vars[var->id + -10];
      loop_vars[var->id + -10] = (var->val).loopvar;
      (var->val).loopvar = sVar1;
    }
  }
  return;
}

Assistant:

void swap(int *start_ofs, int *str_ofs, size_t *curlen,
              re_state_id *state, re_state_id *final,
              re_group_register *regs, short *loop_vars)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* swap the string offset */
        int tmp_ofs = *str_ofs;
        *str_ofs = fp->str_ofs;
        fp->str_ofs = tmp_ofs;

        /* swap the starting offset */
        tmp_ofs = *start_ofs;
        *start_ofs = fp->start_ofs;
        fp->start_ofs = tmp_ofs;

        /* swap the search length */
        size_t tmp_len = *curlen;
        *curlen = fp->curlen;
        fp->curlen = tmp_len;

        /* swap the current machine state */
        re_state_id tmp_id = *state;
        *state = fp->state;
        fp->state = tmp_id;

        /* swap the final machine state */
        tmp_id = *final;
        *final = fp->final;
        fp->final = tmp_id;

        /* swap all group and loop registers with the current state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                re_group_register tmp;
                
                /* it's a group register */
                tmp = regs[var->id];
                regs[var->id] = var->val.group;
                var->val.group = tmp;
            }
            else
            {
                short tmp;
                
                /* it's a loop variable */
                tmp = loop_vars[var->id - RE_GROUP_REG_CNT];
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
                var->val.loopvar = tmp;
            }
        }
    }